

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O3

char * extract_word(char **ptr)

{
  byte *pbVar1;
  ushort **ppuVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)*ptr;
  bVar3 = *pbVar5;
  pbVar4 = pbVar5;
  if (bVar3 != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      pbVar5 = pbVar4 + 1;
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar3 * 2 + 1) & 0x20) == 0) {
        ppuVar2 = __ctype_b_loc();
        pbVar1 = pbVar5;
        goto LAB_00101b9d;
      }
      bVar3 = *pbVar5;
      pbVar4 = pbVar5;
    } while (bVar3 != 0);
  }
  goto LAB_00101bb9;
  while( true ) {
    bVar3 = *pbVar5;
    pbVar1 = pbVar5 + 1;
    if (bVar3 == 0) break;
LAB_00101b9d:
    pbVar5 = pbVar1;
    if ((*(byte *)((long)*ppuVar2 + (ulong)bVar3 * 2 + 1) & 0x20) != 0) {
      pbVar5[-1] = 0;
      pbVar1 = pbVar5;
      goto LAB_00101bcf;
    }
  }
  goto LAB_00101bb9;
  while (pbVar1 = pbVar5 + 1, (*(byte *)((long)*ppuVar2 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0) {
LAB_00101bcf:
    pbVar5 = pbVar1;
    if ((ulong)*pbVar5 == 0) break;
  }
LAB_00101bb9:
  *ptr = (char *)pbVar5;
  return (char *)pbVar4;
}

Assistant:

static const char *extract_word(char **ptr)
{
    char *p = *ptr;
    while (*p && isspace((unsigned char)*p)) p++;

    char *start = p;
    while (*p && !isspace((unsigned char)*p)) p++;

    if (*p) {
        *p++ = '\0';
        while (*p && isspace((unsigned char)*p)) p++;
    }

    *ptr = p;
    return start;
}